

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

void __thiscall
cmCompiledGeneratorExpression::cmCompiledGeneratorExpression
          (cmCompiledGeneratorExpression *this,cmListFileBacktrace *backtrace,string *input)

{
  bool bVar1;
  undefined1 local_70 [8];
  cmGeneratorExpressionParser p;
  vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> tokens;
  cmGeneratorExpressionLexer l;
  string *input_local;
  cmListFileBacktrace *backtrace_local;
  cmCompiledGeneratorExpression *this_local;
  
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,backtrace);
  std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>::
  vector(&this->Evaluators);
  std::__cxx11::string::string((string *)&this->Input,(string *)input);
  std::
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
  set(&this->DependTargets);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->AllTargetsSeen);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SeenTargetProperties);
  std::
  map<const_cmGeneratorTarget_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map(&this->MaxLanguageStandard);
  std::__cxx11::string::string((string *)&this->Output);
  this->HadContextSensitiveCondition = false;
  this->HadHeadSensitiveCondition = false;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->SourceSensitiveTargets);
  this->EvaluateForBuildsystem = false;
  cmGeneratorExpressionLexer::cmGeneratorExpressionLexer
            ((cmGeneratorExpressionLexer *)
             ((long)&tokens.
                     super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  cmGeneratorExpressionLexer::Tokenize
            ((vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *)
             &p.NestingLevel,
             (cmGeneratorExpressionLexer *)
             ((long)&tokens.
                     super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),&this->Input);
  bVar1 = cmGeneratorExpressionLexer::GetSawGeneratorExpression
                    ((cmGeneratorExpressionLexer *)
                     ((long)&tokens.
                             super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  this->NeedsEvaluation = bVar1;
  if ((this->NeedsEvaluation & 1U) != 0) {
    cmGeneratorExpressionParser::cmGeneratorExpressionParser
              ((cmGeneratorExpressionParser *)local_70,
               (vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *)
               &p.NestingLevel);
    cmGeneratorExpressionParser::Parse((cmGeneratorExpressionParser *)local_70,&this->Evaluators);
    cmGeneratorExpressionParser::~cmGeneratorExpressionParser
              ((cmGeneratorExpressionParser *)local_70);
  }
  std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::~vector
            ((vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *)
             &p.NestingLevel);
  return;
}

Assistant:

cmCompiledGeneratorExpression::cmCompiledGeneratorExpression(
              cmListFileBacktrace const& backtrace,
              const std::string& input)
  : Backtrace(backtrace), Input(input),
    HadContextSensitiveCondition(false),
    HadHeadSensitiveCondition(false),
    EvaluateForBuildsystem(false)
{
  cmGeneratorExpressionLexer l;
  std::vector<cmGeneratorExpressionToken> tokens =
                                              l.Tokenize(this->Input);
  this->NeedsEvaluation = l.GetSawGeneratorExpression();

  if (this->NeedsEvaluation)
    {
    cmGeneratorExpressionParser p(tokens);
    p.Parse(this->Evaluators);
    }
}